

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void __thiscall BSDFSampling_Lambertian_Test::TestBody(BSDFSampling_Lambertian_Test *this)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = createLambertian;
  local_10 = std::
             _Function_handler<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>),_pbrt::BSDF_*(*)(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>),_pbrt::BSDF_*(*)(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
             ::_M_manager;
  TestBSDF((function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
            *)local_28,"Lambertian");
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

TEST(BSDFSampling, Lambertian) {
    TestBSDF(createLambertian, "Lambertian");
}